

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O1

int Abc_NtkRenodeEvalBdd(If_Man_t *p,If_Cut_t *pCut)

{
  word *pTruth;
  Vec_Mem_t *pVVar1;
  DdManager *dd;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  word *pwVar5;
  DdNode *n;
  DdNode *n_00;
  uint uVar6;
  char cVar8;
  int pOrder [32];
  int local_a8 [32];
  ulong uVar7;
  
  uVar6 = *(uint *)&pCut->field_0x1c >> 0x18;
  uVar7 = (ulong)uVar6;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    memset(&pCut[1].Area + uVar7,0x9c,(ulong)(uVar6 - 1) + 1);
    uVar4 = 0;
    do {
      local_a8[uVar4] = -100;
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
  }
  dd = s_pDd;
  uVar6 = pCut->iCutFunc;
  if ((int)uVar6 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/if.h"
                  ,0x1aa,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pTruth = p->puTempW;
  pVVar1 = p->vTtMem[uVar7];
  if (pVVar1 == (Vec_Mem_t *)0x0) {
    pwVar5 = (word *)0x0;
  }
  else {
    uVar2 = uVar6 >> 1;
    if (pVVar1->nEntries <= (int)uVar2) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar5 = pVVar1->ppPages[uVar2 >> ((byte)pVVar1->LogPageSze & 0x1f)] +
             (ulong)(uVar2 & pVVar1->PageMask) * (long)pVVar1->nEntrySize;
  }
  uVar2 = p->nTruth6Words[uVar7];
  if ((uVar6 & 1) == 0) {
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        pTruth[uVar4] = pwVar5[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  else if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      pTruth[uVar4] = ~pwVar5[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  cVar8 = '\0';
  n = Kit_TruthToBdd(dd,(uint *)pTruth,(uint)(byte)pCut->field_0x1f,0);
  Cudd_Ref(n);
  n_00 = Extra_Reorder(s_pReo,s_pDd,n,local_a8);
  Cudd_Ref(n_00);
  uVar6 = *(uint *)&pCut->field_0x1c;
  if (0xffffff < uVar6) {
    uVar4 = 0;
    do {
      if (-1 < (long)local_a8[uVar4]) {
        cVar8 = cVar8 + '\x01';
        *(char *)((long)(&pCut[1].Area + uVar7) + (long)local_a8[uVar4]) = cVar8;
      }
      uVar4 = uVar4 + 1;
    } while (uVar6 >> 0x18 != uVar4);
  }
  iVar3 = Cudd_DagSize(n_00);
  Cudd_RecursiveDeref(s_pDd,n_00);
  Cudd_RecursiveDeref(s_pDd,n);
  return iVar3 + -1;
}

Assistant:

int Abc_NtkRenodeEvalBdd( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int pOrder[IF_MAX_LUTSIZE];
    DdNode * bFunc, * bFuncNew;
    int i, k, nNodes;
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = pOrder[i] = -100;
    bFunc = Kit_TruthToBdd( s_pDd, If_CutTruth(p, pCut), If_CutLeaveNum(pCut), 0 );  Cudd_Ref( bFunc );
    bFuncNew = Extra_Reorder( s_pReo, s_pDd, bFunc, pOrder );                     Cudd_Ref( bFuncNew );
    for ( i = k = 0; i < If_CutLeaveNum(pCut); i++ )
        if ( pOrder[i] >= 0 )
            pPerm[pOrder[i]] = ++k; // double-check this!
    nNodes = -1 + Cudd_DagSize( bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFuncNew );
    Cudd_RecursiveDeref( s_pDd, bFunc );
    return nNodes; 
}